

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall
tinyusdz::ascii::AsciiParser::ParseBasicTypeArray<tinyusdz::Reference>
          (AsciiParser *this,
          vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_> *result)

{
  bool bVar1;
  char local_181;
  uint local_180;
  char ce;
  undefined1 local_178 [7];
  bool triple_deliminated;
  Reference ref;
  char c;
  vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_> *result_local;
  AsciiParser *this_local;
  
  bVar1 = SkipWhitespace(this);
  if (bVar1) {
    bVar1 = Char1(this,(char *)((long)&ref.customData._M_t._M_impl.super__Rb_tree_header.
                                       _M_node_count + 7));
    if (bVar1) {
      if (ref.customData._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ == '[') {
        bVar1 = SkipCommentAndWhitespaceAndNewline(this,true);
        if (!bVar1) {
          this_local._7_1_ = 0;
          goto LAB_00591b9b;
        }
        bVar1 = Char1(this,&local_181);
        if (!bVar1) {
          this_local._7_1_ = 0;
          goto LAB_00591b9b;
        }
        if (local_181 == ']') {
          ::std::vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>::clear(result);
          this_local._7_1_ = 1;
          goto LAB_00591b9b;
        }
        Rewind(this,1);
        bVar1 = SepBy1BasicType<tinyusdz::Reference>(this,',',']',result);
        if (!bVar1) {
          this_local._7_1_ = 0;
          goto LAB_00591b9b;
        }
        bVar1 = SkipCommentAndWhitespaceAndNewline(this,true);
        if (!bVar1) {
          this_local._7_1_ = 0;
          goto LAB_00591b9b;
        }
        bVar1 = Expect(this,']');
        if (!bVar1) {
          this_local._7_1_ = 0;
          goto LAB_00591b9b;
        }
      }
      else {
        Rewind(this,1);
        Reference::Reference((Reference *)local_178);
        ce = '\0';
        bVar1 = ParseReference(this,(Reference *)local_178,(bool *)&ce);
        if (bVar1) {
          ::std::vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>::clear(result);
          ::std::vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>::push_back
                    (result,(value_type *)local_178);
        }
        else {
          this_local._7_1_ = 0;
        }
        local_180 = (uint)!bVar1;
        Reference::~Reference((Reference *)local_178);
        if (local_180 != 0) goto LAB_00591b9b;
      }
      this_local._7_1_ = 1;
    }
    else {
      this_local._7_1_ = 0;
    }
  }
  else {
    this_local._7_1_ = 0;
  }
LAB_00591b9b:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool AsciiParser::ParseBasicTypeArray(std::vector<Reference> *result) {
  if (!SkipWhitespace()) {
    return false;
  }

  char c;
  if (!Char1(&c)) {
    return false;
  }

  if (c != '[') {
    Rewind(1);

    // Guess non-list version
    Reference ref;
    bool triple_deliminated{false};
    if (!ParseReference(&ref, &triple_deliminated)) {
      return false;
    }

    (void)triple_deliminated;
    result->clear();
    result->push_back(ref);

  } else {

    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    // Empty array?
    {
      char ce;
      if (!Char1(&ce)) {
        return false;
      }

      if (ce == ']') {
        result->clear();
        return true;
      }

      Rewind(1);
    }


    if (!SepBy1BasicType<Reference>(',', ']', result)) {
      return false;
    }
    DCOUT("parsed ref array");

    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    if (!Expect(']')) {
      return false;
    }

  }

  return true;
}